

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::SVSetBase(SVSetBase<double> *this,SVSetBase<double> *old)

{
  double in_RSI;
  DLPSV *in_RDI;
  ClassArray<soplex::Nonzero<double>_> *unaff_retaddr;
  int in_stack_0000000c;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *in_stack_00000010;
  SVSetBase<double> *in_stack_00000018;
  SVSetBase<double> *in_stack_00000020;
  DLPSV *pfirst;
  IdList<soplex::SVSetBase<double>::DLPSV> *in_stack_ffffffffffffffe0;
  
  ClassArray<soplex::Nonzero<double>_>::ClassArray
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI);
  (in_RDI->super_SVectorBase<double>).m_elem = (Nonzero<double> *)&PTR__SVSetBase_00896ce8;
  pfirst = in_RDI + 1;
  ClassSet<soplex::SVSetBase<double>::DLPSV>::ClassSet(in_stack_00000010,in_stack_0000000c);
  IdList<soplex::SVSetBase<double>::DLPSV>::IdList
            (in_stack_ffffffffffffffe0,pfirst,in_RDI,SUB81((ulong)(in_RDI + 2) >> 0x38,0));
  *(undefined4 *)&in_RDI[2].theprev = *(undefined4 *)((long)in_RSI + 0x58);
  *(undefined4 *)((long)&in_RDI[2].theprev + 4) = *(undefined4 *)((long)in_RSI + 0x5c);
  in_RDI[3].super_SVectorBase<double>.m_elem = *(Nonzero<double> **)((long)in_RSI + 0x60);
  operator=(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

SVSetBase(const SVSetBase<R>& old)
      : SVSetBaseArray()
      , unusedMem(old.unusedMem)
      , numUnusedMemUpdates(old.numUnusedMemUpdates)
      , factor(old.factor)
   {
      *this = old;

      assert(SVSetBase::isConsistent());
   }